

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_shared_ptr.cpp
# Opt level: O1

int main(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  _Atomic_word *p_Var1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  int iVar7;
  element_type *peVar8;
  foo *__p;
  long lVar9;
  bee *__p_00;
  counted *pcVar10;
  ostream *poVar11;
  runtime_error *prVar12;
  __weak_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  bool bVar15;
  shared_ptr<int> p;
  ostringstream oss;
  shared_ptr<foo> f;
  weak_ptr<int> wp;
  shared_ptr<bar> b;
  shared_ptr<bee> bee1;
  shared_ptr<bee> bee2;
  string local_260 [32];
  runtime_error *local_240;
  __shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2> local_238;
  int *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  __shared_ptr<int,(__gnu_cxx::_Lock_policy)2> local_218 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_210;
  element_type *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_98;
  __shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2> local_90;
  __weak_ptr<int,_(__gnu_cxx::_Lock_policy)2> local_80;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  __weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  runtime_error local_40 [16];
  
  local_228 = (int *)operator_new(4);
  *local_228 = 10;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&_Stack_220,local_228);
  _Var13._M_pi = _Stack_220._M_pi;
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_220._M_pi)->_M_use_count = (_Stack_220._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_220._M_pi)->_M_use_count = (_Stack_220._M_pi)->_M_use_count + 1;
    }
  }
  if (*local_228 != 10) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," *p2==10",8);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Stack_220._M_pi)->_M_use_count != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x49);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p2.use_count() == 2",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *local_228 = 0x14;
  if (*local_228 != 0x14) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," *p==20",7);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_80._M_ptr = local_228;
  local_80._M_refcount._M_pi = _Stack_220._M_pi;
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_220._M_pi)->_M_weak_count = (_Stack_220._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_220._M_pi)->_M_weak_count = (_Stack_220._M_pi)->_M_weak_count + 1;
    }
  }
  if ((_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Stack_220._M_pi)->_M_use_count != 2)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p.use_count() == 2",0x13);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var14._M_pi = _Stack_220._M_pi;
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar7 = (_Stack_220._M_pi)->_M_use_count;
    do {
      if (iVar7 == 0) {
        _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar2 = (_Stack_220._M_pi)->_M_use_count;
      bVar15 = iVar7 == iVar2;
      if (bVar15) {
        (_Stack_220._M_pi)->_M_use_count = iVar7 + 1;
        iVar2 = iVar7;
      }
      iVar7 = iVar2;
      UNLOCK();
    } while (!bVar15);
  }
  if (_Var14._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar15 = true;
  }
  else {
    bVar15 = (_Var14._M_pi)->_M_use_count == 0;
  }
  if ((bVar15) || (local_228 == (int *)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x4f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p3",3);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Var14._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Var14._M_pi)->_M_use_count != 3)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p3.use_count() == 3",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*local_228 != 0x14) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x51);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," *p2==20",8);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Stack_220._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Stack_220._M_pi)->_M_use_count == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x52);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," !wp.expired()",0xe);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_228 == (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x53);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p",2);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_228 = (int *)0x0;
  _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var13._M_pi);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var13._M_pi);
  }
  if (local_228 != (int *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," !p",3);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((_Var14._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((_Var14._M_pi)->_M_use_count != 1)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," p3.use_count() == 1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
  this_00._M_pi = local_80._M_refcount._M_pi;
  if (local_80._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if ((local_80._M_refcount._M_pi)->_M_use_count != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
                 ,0x77);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x5b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," wp.expired()",0xd);
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar12,local_260);
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_80._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (local_80._M_refcount._M_pi)->_M_use_count;
      do {
        if (iVar7 == 0) {
          this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          break;
        }
        LOCK();
        iVar2 = (local_80._M_refcount._M_pi)->_M_use_count;
        bVar15 = iVar7 == iVar2;
        if (bVar15) {
          (local_80._M_refcount._M_pi)->_M_use_count = iVar7 + 1;
          iVar2 = iVar7;
        }
        iVar7 = iVar2;
        UNLOCK();
      } while (!bVar15);
    }
  }
  if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar15 = true;
  }
  else {
    bVar15 = (this_00._M_pi)->_M_use_count == 0;
  }
  if ((!bVar15) && (local_80._M_ptr != (int *)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x5d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," !p4",4);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__shared_ptr<int,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<int,void>(local_218,&local_80);
  std::runtime_error::runtime_error(local_40,"Should not get there");
  std::runtime_error::~runtime_error(local_40);
  if (local_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210);
  }
  local_90._M_ptr = (element_type *)operator_new(8);
  (local_90._M_ptr)->_vptr_foo = (_func_int **)&PTR__foo_0010aad0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<foo*>
            (&local_90._M_refcount,local_90._M_ptr);
  local_70 = (element_type *)operator_new(8);
  ((foo *)&local_70->_vptr_foo)->_vptr_foo = (_func_int **)&PTR__foo_0010ab00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<bar*>(&local_68,(bar *)local_70);
  local_90._M_ptr = local_70;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_90._M_refcount,&local_68);
  if (local_90._M_ptr == (element_type *)0x0) {
    peVar8 = (element_type *)0x0;
  }
  else {
    peVar8 = (element_type *)__dynamic_cast(local_90._M_ptr,&foo::typeinfo,&bar::typeinfo,0);
  }
  peVar5 = local_70;
  if (peVar8 == (element_type *)0x0) {
    _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    peVar8 = (element_type *)0x0;
  }
  else {
    _Var13._M_pi = local_90._M_refcount._M_pi;
    if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var13._M_pi);
  }
  peVar6 = local_70;
  peVar4 = local_90._M_ptr;
  if (peVar8 != peVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x68);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," booster::dynamic_pointer_cast<bar>(f)==b",0x29);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
  }
  if (peVar4 != peVar6) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x69);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," booster::static_pointer_cast<bar>(f)==b",0x28);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p = (foo *)operator_new(8);
  __p->_vptr_foo = (_func_int **)&PTR__foo_0010aad0;
  std::__shared_ptr<foo,_(__gnu_cxx::_Lock_policy)2>::reset<foo>(&local_90,__p);
  if (local_90._M_ptr == (element_type *)0x0) {
    bVar15 = true;
  }
  else {
    lVar9 = __dynamic_cast(local_90._M_ptr,&foo::typeinfo,&bar::typeinfo,0);
    bVar15 = lVar9 == 0;
  }
  if (bVar15) {
    _Var13._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    _Var13._M_pi = local_90._M_refcount._M_pi;
    if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_90._M_refcount._M_pi)->_M_use_count = (local_90._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
  }
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var13._M_pi);
  }
  if (!bVar15) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11," booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>()",0x42);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __p_00 = (bee *)operator_new(0x10);
  (__p_00->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__p_00->super_enable_shared_from_this<bee>)._M_weak_this.
  super___weak_ptr<bee,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&local_60,__p_00);
  std::__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<bee,void>
            ((__shared_ptr<bee,(__gnu_cxx::_Lock_policy)2> *)&local_50,local_60);
  if (local_60 != local_50) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x6f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," bee1==bee2",0xb);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x72);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==0",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar10 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar10);
  _Var13._M_pi = local_238._M_refcount._M_pi;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x74);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var13._M_pi);
  }
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x76);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==0",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar10 = (counted *)operator_new(1);
  counted::counter = 1;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar10);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x78);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = local_238._M_ptr;
  _Stack_98._M_pi = local_238._M_refcount._M_pi;
  if (local_238._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_238._M_refcount._M_pi)->_M_use_count = (local_238._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_238._M_refcount._M_pi)->_M_use_count = (local_238._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar10 = (counted *)operator_new(1);
  counted::counter = 2;
  std::__shared_ptr<counted,_(__gnu_cxx::_Lock_policy)2>::reset<counted>(&local_238,pcVar10);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==2",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this = &local_238._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_98,&_Stack_98);
  if (counted::counter != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x7f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==2",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = local_a0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this,&_Stack_98);
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x81);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = local_238._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_98,this);
  _Var13._M_pi = _Stack_98._M_pi;
  peVar3 = local_a0;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x83);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var14._M_pi = _Stack_98._M_pi;
  if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_98._M_pi)->_M_weak_count = (_Stack_98._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_98._M_pi)->_M_weak_count = (_Stack_98._M_pi)->_M_weak_count + 1;
    }
    if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      iVar7 = (_Stack_98._M_pi)->_M_use_count;
      do {
        _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (iVar7 == 0) break;
        LOCK();
        iVar2 = (_Stack_98._M_pi)->_M_use_count;
        bVar15 = iVar7 == iVar2;
        if (bVar15) {
          (_Stack_98._M_pi)->_M_use_count = iVar7 + 1;
          iVar2 = iVar7;
        }
        iVar7 = iVar2;
        UNLOCK();
        _Var14._M_pi = _Stack_98._M_pi;
      } while (!bVar15);
    }
  }
  if (((_Var14._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
      ((_Var14._M_pi)->_M_use_count == 0)) || (local_a0 == (element_type *)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x86);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," cnt3",5);
    local_240 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(local_240,local_260);
    __cxa_throw(local_240,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x87);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    local_240 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(local_240,local_260);
    __cxa_throw(local_240,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
  _Var14._M_pi = _Stack_98._M_pi;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x89);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = (element_type *)0x0;
  _Stack_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
  _Var14._M_pi = local_238._M_refcount._M_pi;
  if (counted::counter != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==1",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_238._M_ptr = (element_type *)0x0;
  local_238._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
  if (counted::counter != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," counted::counter==0",0x14);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  _Var14._M_pi = _Var13._M_pi;
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar7 = (_Var13._M_pi)->_M_use_count;
    do {
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (iVar7 == 0) break;
      LOCK();
      iVar2 = (_Var13._M_pi)->_M_use_count;
      bVar15 = iVar7 == iVar2;
      if (bVar15) {
        (_Var13._M_pi)->_M_use_count = iVar7 + 1;
        iVar2 = iVar7;
      }
      iVar7 = iVar2;
      UNLOCK();
      _Var14._M_pi = _Var13._M_pi;
    } while (!bVar15);
  }
  if (_Var14._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar15 = true;
  }
  else {
    bVar15 = peVar3 == (element_type *)0x0 || (_Var14._M_pi)->_M_use_count == 0;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
  }
  if (!bVar15) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/smart_ptr/test/test_shared_ptr.cpp"
               ,0x77);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)local_218,0x8e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," !wpcnt.lock()",0xe);
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar12,local_260);
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (_Var13._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(_Var13._M_pi)->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (_Var13._M_pi)->_M_weak_count;
      (_Var13._M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(_Var13._M_pi)->_vptr__Sp_counted_base[3])(_Var13._M_pi);
    }
  }
  if (_Stack_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_98._M_pi);
  }
  if (local_238._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_238._M_refcount._M_pi);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  if (local_90._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_refcount._M_pi);
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (local_80._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_80._M_refcount._M_pi)->_M_weak_count;
      iVar7 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar7 = (local_80._M_refcount._M_pi)->_M_weak_count;
      (local_80._M_refcount._M_pi)->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*(local_80._M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (_Stack_220._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ok",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
	try {
		booster::shared_ptr<int> p(new int(10));
		booster::shared_ptr<int> p2=p;
		TEST(*p2==10);
		TEST(p2.use_count() == 2);
		*p2=20;
		TEST(*p==20);
		booster::weak_ptr<int> wp=p;
		TEST(p.use_count() == 2);
		booster::shared_ptr<int> p3=wp.lock();
		TEST(p3);
		TEST(p3.use_count() == 3);
		TEST(*p2==20);
		TEST(!wp.expired());
		TEST(p);
		TEST(!!p);
		p.reset();
		p2.reset();
		TEST(!p);
		TEST(p3.use_count() == 1);
		p3.reset();
		TEST(!p3);
		TEST(wp.expired());
		booster::shared_ptr<int> p4=wp.lock();
		TEST(!p4);

		try {
			booster::shared_ptr<int> p4(wp);
			std::runtime_error("Should not get there");
		}
		catch(booster::bad_weak_ptr const &e){}

		booster::shared_ptr<foo> f(new foo);
		booster::shared_ptr<bar> b(new bar);
		f=b;
		TEST(booster::dynamic_pointer_cast<bar>(f)==b);
		TEST(booster::static_pointer_cast<bar>(f)==b);
		f.reset(new foo);
		TEST(booster::dynamic_pointer_cast<bar>(f)==booster::shared_ptr<bar>());

		booster::shared_ptr<bee> bee1(new bee);
		booster::shared_ptr<bee> bee2=bee1->self();
		TEST(bee1==bee2);

		booster::shared_ptr<counted> cnt;
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		cnt.reset(new counted);
		TEST(counted::counter==1);
		booster::shared_ptr<counted> cnt2(cnt);
		TEST(counted::counter==1);
		cnt.reset(new counted);
		TEST(counted::counter==2);
		cnt=cnt;
		cnt2=cnt2;
		TEST(counted::counter==2);
		cnt=cnt2;
		TEST(counted::counter==1);
		cnt2=cnt;
		TEST(counted::counter==1);
		booster::weak_ptr<counted> wpcnt(cnt2);
		booster::shared_ptr<counted> cnt3=wpcnt.lock();
		TEST(cnt3);
		TEST(counted::counter==1);
		cnt3.reset();
		TEST(counted::counter==1);
		cnt2.reset();
		TEST(counted::counter==1);
		cnt.reset();
		TEST(counted::counter==0);
		TEST(!wpcnt.lock());

	}
	catch(std::exception const &e) {
		std::cerr << "Fail:" << e.what() << std::endl;
		return 1;
	}
	std::cout << "Ok" << std::endl;
	return 0;	
}